

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

SyncInfo __thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::ImplementationBase::getSyncInfo
          (ImplementationBase *this)

{
  bool bVar1;
  SyncInfo SVar2;
  
  bVar1 = this->m_mode == ACCESS_MODE_READ;
  SVar2.imageLayout = bVar1 ^ VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  SVar2._0_8_ = ((ulong)!bVar1 << 0x2b) + 0x80000001000;
  return SVar2;
}

Assistant:

SyncInfo getSyncInfo (void) const
	{
		const VkAccessFlags access		= (m_mode == ACCESS_MODE_READ ? VK_ACCESS_TRANSFER_READ_BIT : VK_ACCESS_TRANSFER_WRITE_BIT);
		const VkImageLayout layout		= (m_mode == ACCESS_MODE_READ ? VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL : VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
		const SyncInfo		syncInfo	=
		{
			VK_PIPELINE_STAGE_TRANSFER_BIT,		// VkPipelineStageFlags		stageMask;
			access,								// VkAccessFlags			accessMask;
			layout,								// VkImageLayout			imageLayout;
		};
		return syncInfo;
	}